

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http2.c
# Opt level: O0

CURLcode Curl_http2_request_upgrade(dynbuf *req,Curl_easy *data)

{
  size_t insize;
  ssize_t binlen;
  uint8_t binsettings [80];
  SingleRequest *k;
  size_t blen;
  char *base64;
  Curl_easy *pCStack_20;
  CURLcode result;
  Curl_easy *data_local;
  dynbuf *req_local;
  
  pCStack_20 = data;
  data_local = (Curl_easy *)req;
  insize = populate_binsettings((uint8_t *)&binlen,data);
  if ((long)insize < 1) {
    Curl_failf(pCStack_20,"nghttp2 unexpectedly failed on pack_settings_payload");
    Curl_dyn_free((dynbuf *)data_local);
    req_local._4_4_ = CURLE_FAILED_INIT;
  }
  else {
    base64._4_4_ = Curl_base64url_encode((char *)&binlen,insize,(char **)&blen,(size_t *)&k);
    if (base64._4_4_ == CURLE_OK) {
      base64._4_4_ = Curl_dyn_addf((dynbuf *)data_local,
                                   "Connection: Upgrade, HTTP2-Settings\r\nUpgrade: %s\r\nHTTP2-Settings: %s\r\n"
                                   ,"h2c",blen);
      (*Curl_cfree)((void *)blen);
      (data->req).upgr101 = UPGR101_H2;
      req_local._4_4_ = base64._4_4_;
    }
    else {
      Curl_dyn_free((dynbuf *)data_local);
      req_local._4_4_ = base64._4_4_;
    }
  }
  return req_local._4_4_;
}

Assistant:

CURLcode Curl_http2_request_upgrade(struct dynbuf *req,
                                    struct Curl_easy *data)
{
  CURLcode result;
  char *base64;
  size_t blen;
  struct SingleRequest *k = &data->req;
  uint8_t binsettings[H2_BINSETTINGS_LEN];
  ssize_t binlen; /* length of the binsettings data */

  binlen = populate_binsettings(binsettings, data);
  if(binlen <= 0) {
    failf(data, "nghttp2 unexpectedly failed on pack_settings_payload");
    Curl_dyn_free(req);
    return CURLE_FAILED_INIT;
  }

  result = Curl_base64url_encode((const char *)binsettings, binlen,
                                 &base64, &blen);
  if(result) {
    Curl_dyn_free(req);
    return result;
  }

  result = Curl_dyn_addf(req,
                         "Connection: Upgrade, HTTP2-Settings\r\n"
                         "Upgrade: %s\r\n"
                         "HTTP2-Settings: %s\r\n",
                         NGHTTP2_CLEARTEXT_PROTO_VERSION_ID, base64);
  free(base64);

  k->upgr101 = UPGR101_H2;

  return result;
}